

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

int chknode(chkctx *ctx,int level,node234_conflict *node,void *lowbound,void *highbound)

{
  node234_conflict *pnVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = 0;
  do {
    if (node->kids[uVar10] == (node234 *)0x0) {
      if (uVar10 < 4) {
        lVar6 = uVar10 + 10;
        do {
          if (node->kids[lVar6 + -10] == (node234 *)0x0) {
            if (*(int *)((long)node->kids + lVar6 * 4 + -8) != 0) {
              error("node %p: kids[%d] NULL but count[%d]=%d nonzero",node,(ulong)((int)lVar6 - 10))
              ;
            }
          }
          else {
            error("node %p: nkids=%d but kids[%d] non-NULL",node,uVar10 & 0xffffffff,
                  (ulong)((int)lVar6 - 10));
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0xe);
      }
      goto LAB_00102a7d;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  uVar10 = 4;
LAB_00102a7d:
  uVar8 = 0;
  do {
    if (node->elems[uVar8] == (void *)0x0) {
      uVar4 = uVar8;
      if (uVar8 < 3) {
        do {
          if (node->elems[uVar4] != (void *)0x0) {
            error("node %p: nelems=%d but elems[%d] non-NULL",node,uVar8 & 0xffffffff,
                  uVar4 & 0xffffffff);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      goto LAB_00102ad0;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  uVar8 = 3;
LAB_00102ad0:
  iVar9 = (int)uVar10;
  uVar3 = (uint)uVar8;
  if (iVar9 == 0) {
    if (ctx->treedepth < 0) {
      ctx->treedepth = level;
    }
    else if (ctx->treedepth != level) {
      error("node %p: leaf at depth %d, previously seen depth %d",node,(ulong)(uint)level);
    }
  }
  else {
    uVar4 = (ulong)(uVar3 + 1);
    if (uVar3 == 0) {
      uVar4 = uVar8 & 0xffffffff;
    }
    if (iVar9 != (int)uVar4) {
      error("node %p: %d elems should mean %d kids but has %d",node,uVar8 & 0xffffffff,uVar4,
            uVar10 & 0xffffffff);
    }
  }
  if (uVar3 == 0) {
    error("node %p: no elems",node);
  }
  ctx->elemcount = ctx->elemcount + uVar3;
  if (-1 < (int)uVar3 && cmp != (cmpfn234)0x0) {
    uVar4 = 0;
    do {
      pvVar5 = lowbound;
      if (uVar4 != 0) {
        pvVar5 = node->elems[uVar4 - 1];
      }
      pvVar7 = highbound;
      if ((uVar8 & 0xffffffff) != uVar4) {
        pvVar7 = node->elems[uVar4];
      }
      if (((pvVar5 != (void *)0x0) && (pvVar7 != (void *)0x0)) &&
         (iVar2 = (*cmp)(pvVar5,pvVar7), -1 < iVar2)) {
        error("node %p: kid comparison [%d=%s,%d=%s] failed",node,(ulong)((int)uVar4 - 1),pvVar5,
              uVar4 & 0xffffffff,pvVar7);
      }
      uVar4 = uVar4 + 1;
    } while ((uVar8 & 0xffffffff) + 1 != uVar4);
  }
  if (iVar9 != 0) {
    uVar4 = 0;
    do {
      pnVar1 = node->kids[uVar4]->parent;
      if (pnVar1 != node) {
        error("node %p kid %d: parent ptr is %p not %p",node,uVar4 & 0xffffffff,pnVar1,node);
      }
      uVar4 = uVar4 + 1;
    } while ((uVar10 & 0xffffffff) != uVar4);
    if (iVar9 != 0) {
      uVar11 = uVar8 & 0xffffffff;
      uVar4 = 0;
      do {
        pvVar5 = lowbound;
        if (uVar4 != 0) {
          pvVar5 = node->elems[uVar4 - 1];
        }
        pvVar7 = highbound;
        if (uVar4 < uVar11) {
          pvVar7 = node->elems[uVar4];
        }
        uVar3 = chknode(ctx,level + 1,node->kids[uVar4],pvVar5,pvVar7);
        if (node->counts[uVar4] != uVar3) {
          error("node %p kid %d: count says %d, subtree really has %d",node,uVar4 & 0xffffffff,
                (ulong)(uint)node->counts[uVar4],(ulong)uVar3);
        }
        uVar3 = (int)uVar8 + uVar3;
        uVar8 = (ulong)uVar3;
        uVar4 = uVar4 + 1;
      } while ((uVar10 & 0xffffffff) != uVar4);
    }
  }
  return uVar3;
}

Assistant:

int chknode(chkctx * ctx, int level, node234 * node,
            void *lowbound, void *highbound)
{
    int nkids, nelems;
    int i;
    int count;

    /* Count the non-NULL kids. */
    for (nkids = 0; nkids < 4 && node->kids[nkids]; nkids++);
    /* Ensure no kids beyond the first NULL are non-NULL. */
    for (i = nkids; i < 4; i++)
        if (node->kids[i]) {
            error("node %p: nkids=%d but kids[%d] non-NULL",
                  node, nkids, i);
        } else if (node->counts[i]) {
            error("node %p: kids[%d] NULL but count[%d]=%d nonzero",
                  node, i, i, node->counts[i]);
        }

    /* Count the non-NULL elements. */
    for (nelems = 0; nelems < 3 && node->elems[nelems]; nelems++);
    /* Ensure no elements beyond the first NULL are non-NULL. */
    for (i = nelems; i < 3; i++)
        if (node->elems[i]) {
            error("node %p: nelems=%d but elems[%d] non-NULL",
                  node, nelems, i);
        }

    if (nkids == 0) {
        /*
         * If nkids==0, this is a leaf node; verify that the tree
         * depth is the same everywhere.
         */
        if (ctx->treedepth < 0)
            ctx->treedepth = level;    /* we didn't know the depth yet */
        else if (ctx->treedepth != level)
            error("node %p: leaf at depth %d, previously seen depth %d",
                  node, level, ctx->treedepth);
    } else {
        /*
         * If nkids != 0, then it should be nelems+1, unless nelems
         * is 0 in which case nkids should also be 0 (and so we
         * shouldn't be in this condition at all).
         */
        int shouldkids = (nelems ? nelems + 1 : 0);
        if (nkids != shouldkids) {
            error("node %p: %d elems should mean %d kids but has %d",
                  node, nelems, shouldkids, nkids);
        }
    }

    /*
     * nelems should be at least 1.
     */
    if (nelems == 0) {
        error("node %p: no elems", node);
    }

    /*
     * Add nelems to the running element count of the whole tree.
     */
    ctx->elemcount += nelems;

    /*
     * Check ordering property: all elements should be strictly >
     * lowbound, strictly < highbound, and strictly < each other in
     * sequence. (lowbound and highbound are NULL at edges of tree
     * - both NULL at root node - and NULL is considered to be <
     * everything and > everything. IYSWIM.)
     */
    if (cmp) {
        for (i = -1; i < nelems; i++) {
            void *lower = (i == -1 ? lowbound : node->elems[i]);
            void *higher =
                (i + 1 == nelems ? highbound : node->elems[i + 1]);
            if (lower && higher && cmp(lower, higher) >= 0) {
                error("node %p: kid comparison [%d=%s,%d=%s] failed",
                      node, i, (char *)lower, i + 1, (char *)higher);
            }
        }
    }

    /*
     * Check parent pointers: all non-NULL kids should have a
     * parent pointer coming back to this node.
     */
    for (i = 0; i < nkids; i++)
        if (node->kids[i]->parent != node) {
            error("node %p kid %d: parent ptr is %p not %p",
                  node, i, node->kids[i]->parent, node);
        }


    /*
     * Now (finally!) recurse into subtrees.
     */
    count = nelems;

    for (i = 0; i < nkids; i++) {
        void *lower = (i == 0 ? lowbound : node->elems[i - 1]);
        void *higher = (i >= nelems ? highbound : node->elems[i]);
        int subcount =
            chknode(ctx, level + 1, node->kids[i], lower, higher);
        if (node->counts[i] != subcount) {
            error("node %p kid %d: count says %d, subtree really has %d",
                  node, i, node->counts[i], subcount);
        }
        count += subcount;
    }

    return count;
}